

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder_suite.cpp
# Opt level: O0

void compact_int8_suite::fail_array8_int8_missing_one(void)

{
  undefined4 local_44;
  value local_40 [2];
  undefined1 local_38 [8];
  decoder decoder;
  value_type input [2];
  
  decoder.current.view._M_str._6_2_ = 0x1a8;
  trial::protocol::bintoken::detail::decoder::decoder<unsigned_char[2]>
            ((decoder *)local_38,(uchar (*) [2])((long)&decoder.current.view._M_str + 6));
  local_40[0] = trial::protocol::bintoken::detail::decoder::code((decoder *)local_38);
  local_44 = 0;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::code::value,trial::protocol::bintoken::token::code::value>
            ("decoder.code()","token::code::end",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/decoder_suite.cpp"
             ,0x59a,"void compact_int8_suite::fail_array8_int8_missing_one()",local_40,&local_44);
  return;
}

Assistant:

void fail_array8_int8_missing_one()
{
    const value_type input[] = { token::code::array8_int8, 0x01 };
    format::detail::decoder decoder(input);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.code(), token::code::end);
}